

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::GetCodedUIntSize(uint64 value)

{
  uint64 value_local;
  undefined4 local_4;
  
  if (value < 0x7f) {
    local_4 = 1;
  }
  else if (value < 0x3fff) {
    local_4 = 2;
  }
  else if (value < 0x1fffff) {
    local_4 = 3;
  }
  else if (value < 0xfffffff) {
    local_4 = 4;
  }
  else if (value < 0x7ffffffff) {
    local_4 = 5;
  }
  else if (value < 0x3ffffffffff) {
    local_4 = 6;
  }
  else if (value < 0x1ffffffffffff) {
    local_4 = 7;
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

int32 GetCodedUIntSize(uint64 value) {
  if (value < 0x000000000000007FULL)
    return 1;
  else if (value < 0x0000000000003FFFULL)
    return 2;
  else if (value < 0x00000000001FFFFFULL)
    return 3;
  else if (value < 0x000000000FFFFFFFULL)
    return 4;
  else if (value < 0x00000007FFFFFFFFULL)
    return 5;
  else if (value < 0x000003FFFFFFFFFFULL)
    return 6;
  else if (value < 0x0001FFFFFFFFFFFFULL)
    return 7;
  return 8;
}